

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

int __thiscall
ON_PolyCurve::IsPolyline
          (ON_PolyCurve *this,ON_SimpleArray<ON_3dPoint> *pline_points,
          ON_SimpleArray<double> *pline_t)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ON_Curve **ppOVar4;
  double *pdVar5;
  ON_3dPoint *pOVar6;
  ON_3dPoint *pOVar7;
  double dVar8;
  double dVar9;
  undefined1 *local_100;
  int *local_f0;
  undefined1 local_98 [8];
  ON_SimpleArray<double> seg_t;
  ON_SimpleArray<ON_3dPoint> seg_points;
  int local_54;
  int seg_count;
  int rc;
  ON_Interval cdom;
  ON_Interval sdom;
  int local_28;
  int seg_rc;
  int seg_i;
  int i;
  ON_SimpleArray<double> *pline_t_local;
  ON_SimpleArray<ON_3dPoint> *pline_points_local;
  ON_PolyCurve *this_local;
  
  ON_Interval::ON_Interval((ON_Interval *)(cdom.m_t + 1));
  ON_Interval::ON_Interval((ON_Interval *)&seg_count);
  local_54 = 0;
  if (pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) {
    ON_SimpleArray<ON_3dPoint>::SetCount(pline_points,0);
  }
  if (pline_t != (ON_SimpleArray<double> *)0x0) {
    ON_SimpleArray<double>::SetCount(pline_t,0);
  }
  iVar1 = Count(this);
  if (iVar1 == 1) {
    ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
    if (*ppOVar4 != (ON_Curve *)0x0) {
      ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
      local_54 = (*((*ppOVar4)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2f])
                           (*ppOVar4,pline_points,pline_t);
    }
    if ((pline_t != (ON_SimpleArray<double> *)0x0) && (0 < local_54)) {
      pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,0);
      dVar8 = *pdVar5;
      pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,1);
      dVar9 = *pdVar5;
      ON_Interval::Set((ON_Interval *)(cdom.m_t + 1),dVar8,dVar9);
      ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
      (*((*ppOVar4)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
      cdom.m_t[0] = dVar9;
      for (seg_rc = 0; iVar1 = ON_SimpleArray<double>::Count(pline_t), seg_rc < iVar1;
          seg_rc = seg_rc + 1) {
        pdVar5 = ON_SimpleArray<double>::operator[](pline_t,seg_rc);
        dVar8 = ON_Interval::TransformParameterTo
                          ((ON_Interval *)&seg_count,(ON_Interval *)(cdom.m_t + 1),*pdVar5);
        pdVar5 = ON_SimpleArray<double>::operator[](pline_t,seg_rc);
        *pdVar5 = dVar8;
      }
    }
  }
  else if (1 < iVar1) {
    ON_SimpleArray<ON_3dPoint>::ON_SimpleArray((ON_SimpleArray<ON_3dPoint> *)&seg_t.m_count);
    ON_SimpleArray<double>::ON_SimpleArray((ON_SimpleArray<double> *)local_98);
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      ON_SimpleArray<ON_3dPoint>::SetCount((ON_SimpleArray<ON_3dPoint> *)&seg_t.m_count,0);
      ON_SimpleArray<double>::SetCount((ON_SimpleArray<double> *)local_98,0);
      ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_28);
      if (pline_points == (ON_SimpleArray<ON_3dPoint> *)0x0) {
        local_f0 = (int *)0x0;
      }
      else {
        local_f0 = &seg_t.m_count;
      }
      if (pline_t == (ON_SimpleArray<double> *)0x0) {
        local_100 = (undefined1 *)0x0;
      }
      else {
        local_100 = local_98;
      }
      iVar2 = (*((*ppOVar4)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2f])
                        (*ppOVar4,local_f0,local_100);
      if (iVar2 < 2) {
        if (pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) {
          ON_SimpleArray<ON_3dPoint>::SetCount(pline_points,0);
        }
        if (pline_t != (ON_SimpleArray<double> *)0x0) {
          ON_SimpleArray<double>::SetCount(pline_t,0);
        }
        local_54 = 0;
        break;
      }
      local_54 = iVar2 + local_54;
      if (local_28 != 0) {
        local_54 = local_54 + -1;
      }
      if (pline_t != (ON_SimpleArray<double> *)0x0) {
        pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,local_28);
        dVar8 = *pdVar5;
        pdVar5 = ON_SimpleArray<double>::operator[](&this->m_t,local_28 + 1);
        dVar9 = *pdVar5;
        ON_Interval::Set((ON_Interval *)(cdom.m_t + 1),dVar8,dVar9);
        ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_28);
        (*((*ppOVar4)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
        cdom.m_t[0] = dVar9;
        for (seg_rc = 0; iVar2 = ON_SimpleArray<double>::Count((ON_SimpleArray<double> *)local_98),
            seg_rc < iVar2; seg_rc = seg_rc + 1) {
          pdVar5 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)local_98,seg_rc);
          dVar8 = ON_Interval::TransformParameterTo
                            ((ON_Interval *)&seg_count,(ON_Interval *)(cdom.m_t + 1),*pdVar5);
          pdVar5 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)local_98,seg_rc);
          *pdVar5 = dVar8;
        }
        iVar2 = ON_SimpleArray<double>::Count(pline_t);
        if (0 < iVar2) {
          ON_SimpleArray<double>::Remove(pline_t);
        }
        iVar2 = ON_SimpleArray<double>::Count((ON_SimpleArray<double> *)local_98);
        pdVar5 = ON_SimpleArray<double>::Array((ON_SimpleArray<double> *)local_98);
        ON_SimpleArray<double>::Append(pline_t,iVar2,pdVar5);
      }
      if (pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) {
        iVar2 = ON_SimpleArray<ON_3dPoint>::Count(pline_points);
        if (0 < iVar2) {
          ON_SimpleArray<ON_3dPoint>::Remove(pline_points);
        }
        iVar2 = ON_SimpleArray<ON_3dPoint>::Count((ON_SimpleArray<ON_3dPoint> *)&seg_t.m_count);
        pOVar6 = ON_SimpleArray<ON_3dPoint>::Array((ON_SimpleArray<ON_3dPoint> *)&seg_t.m_count);
        ON_SimpleArray<ON_3dPoint>::Append(pline_points,iVar2,pOVar6);
      }
    }
    uVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
    if ((((uVar3 & 1) != 0) && (pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0)) &&
       (iVar1 = ON_SimpleArray<ON_3dPoint>::Count(pline_points), 3 < iVar1)) {
      pOVar6 = ON_SimpleArray<ON_3dPoint>::First(pline_points);
      pOVar7 = ON_SimpleArray<ON_3dPoint>::Last(pline_points);
      pOVar7->x = pOVar6->x;
      pOVar7->y = pOVar6->y;
      pOVar7->z = pOVar6->z;
    }
    ON_SimpleArray<double>::~ON_SimpleArray((ON_SimpleArray<double> *)local_98);
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray((ON_SimpleArray<ON_3dPoint> *)&seg_t.m_count);
  }
  return local_54;
}

Assistant:

int ON_PolyCurve::IsPolyline(
      ON_SimpleArray<ON_3dPoint>* pline_points,
      ON_SimpleArray<double>* pline_t
      ) const
{
  int i, seg_i, seg_rc;
  ON_Interval sdom, cdom;
  int rc = 0;
  if ( pline_points )
    pline_points->SetCount(0);
  if ( pline_t )
    pline_t->SetCount(0);
  const int seg_count = Count();
  if ( seg_count == 1 )
  {
    if ( m_segment[0] )
      rc = m_segment[0]->IsPolyline(pline_points,pline_t);
    if (pline_t && rc > 0)
    {
      sdom.Set(m_t[0],m_t[1]);
      cdom = m_segment[0]->Domain();
      for ( i = 0; i < pline_t->Count(); i++ )
        (*pline_t)[i] = cdom.TransformParameterTo(sdom, (*pline_t)[i]);
    }
  }
  else if (seg_count > 1 )
  {
    ON_SimpleArray<ON_3dPoint> seg_points;
    ON_SimpleArray<double> seg_t;
    for ( seg_i = 0; seg_i < seg_count; seg_i++ )
    {
      seg_points.SetCount(0);
      seg_t.SetCount(0);
      seg_rc = m_segment[seg_i]->IsPolyline(pline_points?&seg_points:0,pline_t?&seg_t:0);
      if ( seg_rc < 2 )
      {
        if ( pline_points )
          pline_points->SetCount(0);
        if ( pline_t )
          pline_t->SetCount(0);
        rc = 0;
        break;
      }
      rc += seg_rc;
      if ( seg_i )
        rc--;
      if ( pline_t )
      {
        sdom.Set( m_t[seg_i], m_t[seg_i+1] );
        cdom = m_segment[seg_i]->Domain();

        for (i = 0; i < seg_t.Count(); i++)
          seg_t[i] = cdom.TransformParameterTo(sdom, seg_t[i]);

        if ( pline_t->Count() > 0 )
          pline_t->Remove();
        pline_t->Append( seg_t.Count(), seg_t.Array() );
      }
      if ( pline_points )
      {
        if ( pline_points->Count() > 0 )
          pline_points->Remove();
        pline_points->Append( seg_points.Count(), seg_points.Array() );
      }
    }
    if(IsClosed() && pline_points && pline_points->Count() > 3)
    {
      // GBA 2/26/03. Make closed polylines spot on closed
      *pline_points->Last() = *pline_points->First();
    }
  }
  return rc;
}